

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

EndsWithMatcher *
Catch::Matchers::EndsWith
          (EndsWithMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  undefined1 auStack_38 [40];
  
  StdString::CasedString::CasedString((CasedString *)auStack_38,str,caseSensitivity);
  StdString::EndsWithMatcher::EndsWithMatcher(__return_storage_ptr__,(CasedString *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

StdString::EndsWithMatcher EndsWith( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::EndsWithMatcher( StdString::CasedString( str, caseSensitivity) );
    }